

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.c
# Opt level: O1

void process_arg(ArgumentState *arg_state,int i,char ***argv)

{
  byte bVar1;
  ArgumentDescription *pAVar2;
  FILE *__stream;
  int iVar3;
  uint uVar4;
  uint *puVar5;
  size_t sVar6;
  long lVar7;
  void *pvVar8;
  char **ppcVar9;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  uint uVar14;
  bool bVar15;
  double dVar16;
  
  pAVar2 = arg_state->desc;
  if ((byte *)pAVar2[i].type == (byte *)0x0) {
LAB_0014160f:
    pcVar11 = (char *)0x0;
  }
  else {
    bVar1 = *pAVar2[i].type;
    if (bVar1 < 0x54) {
      if (bVar1 == 0x2b) {
        *(int *)pAVar2[i].location = *pAVar2[i].location + 1;
        goto LAB_0014160f;
      }
      if (bVar1 == 0x46) {
LAB_001415eb:
        bVar15 = bVar1 == 0x46;
        puVar5 = (uint *)pAVar2[i].location;
        goto LAB_0014160d;
      }
    }
    else {
      if (bVar1 == 0x54) {
        puVar5 = (uint *)pAVar2[i].location;
        bVar15 = *puVar5 == 0;
LAB_0014160d:
        *puVar5 = (uint)bVar15;
        goto LAB_0014160f;
      }
      if (bVar1 == 0x66) goto LAB_001415eb;
    }
    pcVar11 = **argv;
    pcVar12 = pcVar11 + 1;
    **argv = pcVar12;
    ppcVar9 = *argv;
    if (pcVar11[1] == '\0') {
      ppcVar9 = ppcVar9 + 1;
      *argv = ppcVar9;
    }
    pcVar11 = *ppcVar9;
    if (pcVar11 == (char *)0x0) {
      usage(arg_state,pcVar12);
LAB_001416a7:
      process_arg_cold_1();
      pAVar2 = arg_state->desc;
      fprintf(_stderr,"Usage: %s [flags|args]\n",arg_state->program_name);
      pcVar11 = pAVar2->name;
      if (pcVar11 != (char *)0x0) {
        pcVar12 = &pAVar2->key;
        do {
          __stream = _stderr;
          if (*(char **)(pcVar12 + 8) == (char *)0x0) goto LAB_001416fc;
          uVar14 = (uint)*pcVar12;
          uVar4 = 0x2d;
          if (uVar14 == 0x20) {
            uVar4 = 0x20;
          }
          uVar10 = 0x2c;
          if (uVar14 == 0x20) {
            uVar10 = 0x20;
          }
          sVar6 = strlen(pcVar11);
          pcVar13 = "                                                                               "
                    + sVar6 + 0x3d;
          if (0x50 < sVar6 + 0x3d) {
            pcVar13 = "";
          }
          lVar7 = 8;
          if (*(char **)(pcVar12 + 0x10) != (char *)0x0) {
            pvVar8 = memchr("ISDfF+TL",(int)**(char **)(pcVar12 + 0x10),9);
            lVar7 = (long)pvVar8 + -0x14b3a9;
          }
          iVar3 = 0;
          fprintf(__stream,"  %c%c%c --%s%s%s",(ulong)uVar4,(ulong)uVar14,(ulong)uVar10,pcVar11,
                  pcVar13,arg_types_desc_rel + *(int *)(arg_types_desc_rel + lVar7 * 4));
          if (*(char **)(pcVar12 + 0x10) != (char *)0x0) {
            iVar3 = (int)**(char **)(pcVar12 + 0x10);
          }
          if (0x52 < iVar3) {
            if (iVar3 == 0x53) {
              pcVar11 = *(char **)(pcVar12 + 0x18);
              if (*pcVar11 == '\0') {
                pcVar11 = " (null)   ";
                goto LAB_001418b6;
              }
              sVar6 = strlen(pcVar11);
              if (sVar6 < 10) {
                pcVar13 = " %-9s";
              }
              else {
                pcVar11[7] = '\0';
                pcVar11 = *(char **)(pcVar12 + 0x18);
                pcVar13 = " %-7s..";
              }
              goto LAB_00141879;
            }
            if ((iVar3 == 0x54) || (iVar3 == 0x66)) goto switchD_001417ea_caseD_46;
            goto switchD_001417ea_caseD_45;
          }
          switch(iVar3) {
          case 0x44:
            fprintf(_stderr," %-9.3e",**(undefined8 **)(pcVar12 + 0x18));
            break;
          case 0x45:
          case 0x47:
          case 0x48:
          case 0x4a:
          case 0x4b:
            break;
          case 0x46:
switchD_001417ea_caseD_46:
            pcVar11 = "true ";
            if (**(int **)(pcVar12 + 0x18) == 0) {
              pcVar11 = "false";
            }
            pcVar13 = " %-9s";
            goto LAB_00141879;
          case 0x49:
switchD_001417ea_caseD_49:
            fprintf(_stderr," %-9d",(ulong)**(uint **)(pcVar12 + 0x18));
            break;
          case 0x4c:
            pcVar11 = (char *)**(undefined8 **)(pcVar12 + 0x18);
            pcVar13 = " %-9ld";
LAB_00141879:
            fprintf(_stderr,pcVar13,pcVar11);
            break;
          default:
            if (iVar3 == 0) {
              pcVar11 = "          ";
LAB_001418b6:
              fwrite(pcVar11,10,1,_stderr);
            }
            else if (iVar3 == 0x2b) goto switchD_001417ea_caseD_49;
          }
switchD_001417ea_caseD_45:
          fprintf(_stderr," %s\n",*(char **)(pcVar12 + 8));
LAB_001416fc:
          pcVar11 = *(char **)(pcVar12 + 0x30);
          pcVar12 = pcVar12 + 0x38;
        } while (pcVar11 != (char *)0x0);
      }
      exit(1);
    }
    if (bVar1 < 0x4c) {
      if (bVar1 == 0x44) {
        dVar16 = atof(pcVar11);
        *(double *)pAVar2[i].location = dVar16;
      }
      else {
        if (bVar1 != 0x49) goto LAB_001416a7;
        iVar3 = atoi(pcVar11);
        *(int *)pAVar2[i].location = iVar3;
      }
    }
    else if (bVar1 == 0x4c) {
      lVar7 = atol(pcVar11);
      *(long *)pAVar2[i].location = lVar7;
    }
    else {
      if (bVar1 != 0x53) goto LAB_001416a7;
      pcVar12 = (char *)pAVar2[i].location;
      iVar3 = atoi(pAVar2[i].type + 1);
      strncpy(pcVar12,pcVar11,(long)iVar3);
    }
    ppcVar9 = *argv;
    pcVar12 = *ppcVar9;
    sVar6 = strlen(pcVar12);
    *ppcVar9 = pcVar12 + (sVar6 - 1);
  }
  if (pAVar2[i].pfn == (ArgumentFunction *)0x0) {
    return;
  }
  (*pAVar2[i].pfn)(arg_state,pcVar11);
  return;
}

Assistant:

void process_arg(ArgumentState *arg_state, int i, char ***argv) {
  char *arg = NULL;
  ArgumentDescription *desc = arg_state->desc;
  if (desc[i].type) {
    char type = desc[i].type[0];
    if (type == 'F' || type == 'f')
      *(int *)desc[i].location = type == 'F' ? 1 : 0;
    else if (type == 'T')
      *(int *)desc[i].location = !*(int *)desc[i].location;
    else if (type == '+')
      (*(int *)desc[i].location)++;
    else {
      arg = *++(**argv) ? **argv : *++(*argv);
      if (!arg) usage(arg_state, NULL);
      switch (type) {
        case 'I':
          *(int *)desc[i].location = atoi(arg);
          break;
        case 'D':
          *(double *)desc[i].location = atof(arg);
          break;
        case 'L':
          *(int64 *)desc[i].location = atoll(arg);
          break;
        case 'S':
          strncpy((char *)desc[i].location, arg, atoi(desc[i].type + 1));
          break;
        default:
          fprintf(stderr, "%s:bad argument description\n", arg_state->program_name);
          exit(1);
          break;
      }
      **argv += strlen(**argv) - 1;
    }
  }
  if (desc[i].pfn) desc[i].pfn(arg_state, arg);
}